

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O1

int Abc_NtkTestScorrWriteEquivPair
              (Abc_Ntk_t *pNetlist,Vec_Int_t *vId2Name,int Id1,int Id2,FILE *pFile,int fPol)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  pcVar1 = Abc_NtkTestScorrGetName(pNetlist,vId2Name,Id1);
  pcVar2 = Abc_NtkTestScorrGetName(pNetlist,vId2Name,Id2);
  iVar3 = 0;
  if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
    pcVar4 = "~";
    if (fPol == 0) {
      pcVar4 = "";
    }
    fprintf((FILE *)pFile,"%s=%s%s\n",pcVar1,pcVar4,pcVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Abc_NtkTestScorrWriteEquivPair( Abc_Ntk_t * pNetlist, Vec_Int_t * vId2Name, int Id1, int Id2, FILE * pFile, int fPol )
{
    char * pName1 = Abc_NtkTestScorrGetName( pNetlist, vId2Name, Id1 );
    char * pName2 = Abc_NtkTestScorrGetName( pNetlist, vId2Name, Id2 );
    if ( pName1 == NULL || pName2 == NULL )
        return 0;
    fprintf( pFile, "%s=%s%s\n", pName1, fPol? "~": "", pName2 );
    return 1;
}